

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  IM_DELETE<char>(this->Name);
  ImVector<ImGuiOldColumns>::clear_destruct(&this->ColumnsStorage);
  ImDrawList::~ImDrawList(&this->DrawListInst);
  ImVector<ImGuiOldColumns>::~ImVector(&this->ColumnsStorage);
  ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->StateStorage).Data);
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  ImVector<unsigned_int>::~ImVector(&this->IDStack);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    ColumnsStorage.clear_destruct();
}